

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O1

double __thiscall
chrono::ChOptimizerGenetic::Get_fitness_interval
          (ChOptimizerGenetic *this,ChGenotype **my_population)

{
  double dVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  ChGenotype *mselected;
  ChGenotype *pCVar5;
  long lVar6;
  ChGenotype *pCVar7;
  long lVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  pCVar5 = *my_population;
  iVar2 = *(int *)&(this->super_ChOptimizer).field_0x144;
  lVar6 = (long)iVar2;
  pCVar7 = pCVar5;
  if (0 < lVar6) {
    auVar11 = ZEXT864((ulong)pCVar5->fitness);
    lVar8 = 0;
    auVar12._8_8_ = 0x7fffffffffffffff;
    auVar12._0_8_ = 0x7fffffffffffffff;
    do {
      dVar1 = my_population[lVar8]->fitness;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar1;
      auVar13 = vandpd_avx(auVar15,auVar12);
      uVar3 = vcmppd_avx512vl(auVar13,ZEXT816(0x412e847e00000000),4);
      uVar4 = vcmppd_avx512vl(auVar11._0_16_,auVar15,1);
      bVar9 = (bool)((byte)uVar3 & 3 & (byte)uVar4 & 1);
      if (bVar9 != false) {
        pCVar7 = my_population[lVar8];
      }
      auVar11 = ZEXT1664(CONCAT88(auVar11._8_8_,
                                  (ulong)bVar9 * (long)dVar1 + (ulong)!bVar9 * auVar11._0_8_));
      lVar8 = lVar8 + 1;
    } while (lVar6 != lVar8);
  }
  if (0 < iVar2) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = pCVar5->fitness;
    lVar8 = 0;
    auVar14._8_8_ = 0x7fffffffffffffff;
    auVar14._0_8_ = 0x7fffffffffffffff;
    do {
      dVar1 = my_population[lVar8]->fitness;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar1;
      auVar12 = vandpd_avx(auVar16,auVar14);
      uVar3 = vcmppd_avx512vl(auVar12,ZEXT816(0x412e847e00000000),4);
      uVar4 = vcmppd_avx512vl(auVar16,auVar13,1);
      bVar9 = (bool)((byte)uVar3 & 3 & (byte)uVar4 & 1);
      if (bVar9 != false) {
        pCVar5 = my_population[lVar8];
      }
      auVar10._0_8_ = (ulong)bVar9 * (long)dVar1 + (ulong)!bVar9 * auVar13._0_8_;
      auVar10._8_8_ = auVar13._8_8_;
      lVar8 = lVar8 + 1;
      auVar13 = auVar10;
    } while (lVar6 != lVar8);
  }
  return pCVar7->fitness - pCVar5->fitness;
}

Assistant:

ChGenotype* ChOptimizerGenetic::Select_best(ChGenotype** my_population) {
    ChGenotype* mselected = my_population[0];
    double mbestfitness = my_population[0]->fitness;

    for (int i = 0; i < popsize; i++) {
        if (fabs(my_population[i]->fitness) != OPT_IMPOSSIBLE)
            if (my_population[i]->fitness > mbestfitness) {
                mselected = my_population[i];
                mbestfitness = my_population[i]->fitness;
            }
    }
    // default .
    return mselected;
}